

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O2

json_t * pack(scanner_t *s,va_list *ap)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  undefined7 uVar4;
  int iVar5;
  json_t *pjVar6;
  char *pcVar7;
  json_t *pjVar8;
  void *pvVar9;
  double *pdVar10;
  int *piVar11;
  longlong *plVar12;
  long *plVar13;
  char *source;
  longlong value;
  int local_3c;
  size_t len;
  
  cVar1 = (s->token).token;
  switch(cVar1) {
  case 'f':
    uVar2 = (*ap)[0].fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar10 = (double *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar10 = (double *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = pdVar10 + 1;
    }
    pjVar6 = json_real(*pdVar10);
    return pjVar6;
  case 'g':
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
    goto switchD_00107369_caseD_67;
  case 'i':
    uVar2 = (*ap)[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar11 = (int *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar2 + 8;
    }
    else {
      piVar11 = (int *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = piVar11 + 2;
    }
    value = (longlong)*piVar11;
LAB_001076a9:
    pjVar6 = json_integer(value);
    return pjVar6;
  case 'o':
    next_token(s);
    cVar1 = (s->token).token;
    if (cVar1 != '?') {
      uVar4 = *(undefined7 *)&(s->token).field_0x11;
      (s->next_token).token = (s->token).token;
      *(undefined7 *)&(s->next_token).field_0x11 = uVar4;
      iVar5 = (s->token).column;
      sVar3 = (s->token).pos;
      (s->next_token).line = (s->token).line;
      (s->next_token).column = iVar5;
      (s->next_token).pos = sVar3;
      iVar5 = (s->prev_token).column;
      sVar3 = (s->prev_token).pos;
      (s->token).line = (s->prev_token).line;
      (s->token).column = iVar5;
      (s->token).pos = sVar3;
      uVar4 = *(undefined7 *)&(s->prev_token).field_0x11;
      (s->token).token = (s->prev_token).token;
      *(undefined7 *)&(s->token).field_0x11 = uVar4;
    }
    uVar2 = (*ap)[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar13 = (long *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar2 + 8;
    }
    else {
      plVar13 = (long *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = plVar13 + 1;
    }
    pjVar6 = (json_t *)*plVar13;
    if (cVar1 != '?') {
      return pjVar6;
    }
    if (pjVar6 != (json_t *)0x0) {
      return pjVar6;
    }
  case 'n':
switchD_00107369_caseD_6e:
    pjVar6 = json_null();
    return pjVar6;
  default:
    if (cVar1 == 'I') {
      uVar2 = (*ap)[0].gp_offset;
      if ((ulong)uVar2 < 0x29) {
        plVar12 = (longlong *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
        (*ap)[0].gp_offset = uVar2 + 8;
      }
      else {
        plVar12 = (longlong *)(*ap)[0].overflow_arg_area;
        (*ap)[0].overflow_arg_area = plVar12 + 1;
      }
      value = *plVar12;
      goto LAB_001076a9;
    }
    if (cVar1 == 'O') {
      next_token(s);
      cVar1 = (s->token).token;
      if (cVar1 != '?') {
        uVar4 = *(undefined7 *)&(s->token).field_0x11;
        (s->next_token).token = (s->token).token;
        *(undefined7 *)&(s->next_token).field_0x11 = uVar4;
        iVar5 = (s->token).column;
        sVar3 = (s->token).pos;
        (s->next_token).line = (s->token).line;
        (s->next_token).column = iVar5;
        (s->next_token).pos = sVar3;
        iVar5 = (s->prev_token).column;
        sVar3 = (s->prev_token).pos;
        (s->token).line = (s->prev_token).line;
        (s->token).column = iVar5;
        (s->token).pos = sVar3;
        uVar4 = *(undefined7 *)&(s->prev_token).field_0x11;
        (s->token).token = (s->prev_token).token;
        *(undefined7 *)&(s->token).field_0x11 = uVar4;
      }
      uVar2 = (*ap)[0].gp_offset;
      if ((ulong)uVar2 < 0x29) {
        plVar13 = (long *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
        (*ap)[0].gp_offset = uVar2 + 8;
      }
      else {
        plVar13 = (long *)(*ap)[0].overflow_arg_area;
        (*ap)[0].overflow_arg_area = plVar13 + 1;
      }
      pjVar6 = (json_t *)*plVar13;
      if ((cVar1 != '?') || (pjVar6 != (json_t *)0x0)) {
        if (pjVar6 == (json_t *)0x0) {
          return (json_t *)0x0;
        }
        if (pjVar6->refcount == 0xffffffffffffffff) {
          return pjVar6;
        }
        pjVar6->refcount = pjVar6->refcount + 1;
        return pjVar6;
      }
      goto switchD_00107369_caseD_6e;
    }
    if (cVar1 == '[') {
      pjVar6 = json_array();
      next_token(s);
      do {
        cVar1 = (s->token).token;
        if (cVar1 == ']') {
          return pjVar6;
        }
        if (cVar1 == '\0') goto LAB_00107704;
        pjVar8 = pack(s,ap);
        if (pjVar8 == (json_t *)0x0) {
          pvVar9 = memchr("soO",(int)(s->token).token,4);
          if ((pvVar9 == (void *)0x0) || ((s->next_token).token != '*')) goto LAB_0010772f;
LAB_001074b4:
          next_token(s);
        }
        else {
          iVar5 = json_array_append_new(pjVar6,pjVar8);
          if (iVar5 != 0) {
            source = "<internal>";
            pcVar7 = "Unable to append to array";
            goto LAB_00107725;
          }
          pvVar9 = memchr("soO",(int)(s->token).token,4);
          if ((pvVar9 != (void *)0x0) && ((s->next_token).token == '*')) goto LAB_001074b4;
        }
        next_token(s);
      } while( true );
    }
    if (cVar1 == 'b') {
      uVar2 = (*ap)[0].gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar11 = (int *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
        (*ap)[0].gp_offset = uVar2 + 8;
      }
      else {
        piVar11 = (int *)(*ap)[0].overflow_arg_area;
        (*ap)[0].overflow_arg_area = piVar11 + 2;
      }
      if (*piVar11 != 0) {
        pjVar6 = json_true();
        return pjVar6;
      }
      pjVar6 = json_false();
      return pjVar6;
    }
    if (cVar1 == 's') {
      next_token(s);
      cVar1 = (s->token).token;
      if (cVar1 != '?') {
        uVar4 = *(undefined7 *)&(s->token).field_0x11;
        (s->next_token).token = (s->token).token;
        *(undefined7 *)&(s->next_token).field_0x11 = uVar4;
        iVar5 = (s->token).column;
        sVar3 = (s->token).pos;
        (s->next_token).line = (s->token).line;
        (s->next_token).column = iVar5;
        (s->next_token).pos = sVar3;
        iVar5 = (s->prev_token).column;
        sVar3 = (s->prev_token).pos;
        (s->token).line = (s->prev_token).line;
        (s->token).column = iVar5;
        (s->token).pos = sVar3;
        uVar4 = *(undefined7 *)&(s->prev_token).field_0x11;
        (s->token).token = (s->prev_token).token;
        *(undefined7 *)&(s->token).field_0x11 = uVar4;
      }
      pcVar7 = read_string(s,ap,"string",&len,&local_3c);
      if (pcVar7 == (char *)0x0) {
        if (cVar1 != '?') {
          return (json_t *)0x0;
        }
        pjVar6 = json_null();
        return pjVar6;
      }
      if (local_3c != 0) {
        pjVar6 = jsonp_stringn_nocheck_own(pcVar7,len);
        return pjVar6;
      }
      pjVar6 = json_stringn_nocheck(pcVar7,len);
      return pjVar6;
    }
    if (cVar1 == '{') {
      pjVar6 = json_object();
      next_token(s);
      while( true ) {
        cVar1 = (s->token).token;
        if (cVar1 == '}') {
          return pjVar6;
        }
        if (cVar1 != 's') break;
        pcVar7 = read_string(s,ap,"object key",&len,&local_3c);
        if (pcVar7 == (char *)0x0) goto LAB_0010772f;
        next_token(s);
        pjVar8 = pack(s,ap);
        if (pjVar8 == (json_t *)0x0) {
          if (local_3c != 0) {
            jsonp_free(pcVar7);
          }
          pvVar9 = memchr("soO",(int)(s->token).token,4);
          if ((pvVar9 == (void *)0x0) || ((s->next_token).token != '*')) goto LAB_0010772f;
LAB_00107346:
          next_token(s);
        }
        else {
          iVar5 = json_object_set_new_nocheck(pjVar6,pcVar7,pjVar8);
          if (iVar5 != 0) {
            set_error(s,"<internal>","Unable to add key \"%s\"",pcVar7);
            if (local_3c != 0) {
              jsonp_free(pcVar7);
            }
            goto LAB_0010772f;
          }
          if (local_3c != 0) {
            jsonp_free(pcVar7);
          }
          pvVar9 = memchr("soO",(int)(s->token).token,4);
          if ((pvVar9 != (void *)0x0) && ((s->next_token).token == '*')) goto LAB_00107346;
        }
        next_token(s);
      }
      if (cVar1 == '\0') {
LAB_00107704:
        source = "<format>";
        pcVar7 = "Unexpected end of format string";
LAB_00107725:
        set_error(s,source,pcVar7);
      }
      else {
        set_error(s,"<format>","Expected format \'s\', got \'%c\'");
      }
LAB_0010772f:
      json_decref(pjVar6);
      return (json_t *)0x0;
    }
switchD_00107369_caseD_67:
    set_error(s,"<format>","Unexpected format character \'%c\'",(ulong)(uint)(int)cVar1);
    return (json_t *)0x0;
  }
}

Assistant:

static json_t *pack(scanner_t *s, va_list *ap)
{
    switch(token(s)) {
        case '{':
            return pack_object(s, ap);

        case '[':
            return pack_array(s, ap);

        case 's': /* string */
            return pack_string(s, ap);

        case 'n': /* null */
            return json_null();

        case 'b': /* boolean */
            return va_arg(*ap, int) ? json_true() : json_false();

        case 'i': /* integer from int */
            return json_integer(va_arg(*ap, int));

        case 'I': /* integer from json_int_t */
            return json_integer(va_arg(*ap, json_int_t));

        case 'f': /* real */
            return json_real(va_arg(*ap, double));

        case 'O': /* a json_t object; increments refcount */
        {
            int nullable;
            json_t *json;

            next_token(s);
            nullable = token(s) == '?';
            if (!nullable)
                prev_token(s);

            json = va_arg(*ap, json_t *);
            if (!json && nullable) {
                return json_null();
            } else {
                return json_incref(json);
            }
        }

        case 'o': /* a json_t object; doesn't increment refcount */
        {
            int nullable;
            json_t *json;

            next_token(s);
            nullable = token(s) == '?';
            if (!nullable)
                prev_token(s);

            json = va_arg(*ap, json_t *);
            if (!json && nullable) {
                return json_null();
            } else {
                return json;
            }
        }

        default:
            set_error(s, "<format>", "Unexpected format character '%c'",
                      token(s));
            return NULL;
    }
}